

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem_const&>
          (QPodArrayOps<QScriptItem> *this,qsizetype i,QScriptItem *args)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  qsizetype qVar7;
  QScriptItem *pQVar8;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QScriptItem> *in_RDI;
  long in_FS_OFFSET;
  QScriptItem *where;
  GrowthPosition pos;
  bool detach;
  QScriptItem tmp;
  QArrayDataPointer<QScriptItem> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar10;
  QArrayDataPointer<QScriptItem> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar6 = QArrayDataPointer<QScriptItem>::needsDetach(in_stack_ffffffffffffffb0);
  uVar10 = CONCAT13(bVar6,(int3)in_stack_ffffffffffffffbc);
  if (!bVar6) {
    if ((in_RSI == in_RDI->size) &&
       (qVar7 = QArrayDataPointer<QScriptItem>::freeSpaceAtEnd
                          ((QArrayDataPointer<QScriptItem> *)
                           CONCAT44(uVar10,in_stack_ffffffffffffffb8)), qVar7 != 0)) {
      pQVar8 = QArrayDataPointer<QScriptItem>::end(in_stack_ffffffffffffffb0);
      uVar2 = *in_RDX;
      pQVar8->position = (int)uVar2;
      pQVar8->analysis = (QScriptAnalysis)(int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[1];
      pQVar8->num_glyphs = (short)uVar2;
      *(short *)&pQVar8->field_0xa = (short)((ulong)uVar2 >> 0x10);
      pQVar8->descent = (QFixed)(int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[2];
      pQVar8->ascent = (QFixed)(int)uVar2;
      pQVar8->leading = (QFixed)(int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[3];
      pQVar8->width = (QFixed)(int)uVar2;
      pQVar8->glyph_data_offset = (int)((ulong)uVar2 >> 0x20);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0083efb9;
    }
    if ((in_RSI == 0) &&
       (qVar7 = QArrayDataPointer<QScriptItem>::freeSpaceAtBegin
                          ((QArrayDataPointer<QScriptItem> *)
                           CONCAT44(uVar10,in_stack_ffffffffffffffb8)), qVar7 != 0)) {
      pQVar8 = QArrayDataPointer<QScriptItem>::begin((QArrayDataPointer<QScriptItem> *)0x83ee96);
      uVar2 = *in_RDX;
      pQVar8[-1].position = (int)uVar2;
      pQVar8[-1].analysis = (QScriptAnalysis)(int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[1];
      pQVar8[-1].num_glyphs = (short)uVar2;
      *(short *)&pQVar8[-1].field_0xa = (short)((ulong)uVar2 >> 0x10);
      pQVar8[-1].descent = (QFixed)(int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[2];
      pQVar8[-1].ascent = (QFixed)(int)uVar2;
      pQVar8[-1].leading = (QFixed)(int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[3];
      pQVar8[-1].width = (QFixed)(int)uVar2;
      pQVar8[-1].glyph_data_offset = (int)((ulong)uVar2 >> 0x20);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0083efb9;
    }
  }
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  uVar4 = in_RDX[2];
  uVar5 = in_RDX[3];
  uVar9 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar9 = 1;
  }
  QArrayDataPointer<QScriptItem>::detachAndGrow
            (this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QScriptItem **)CONCAT44(uVar10,uVar9),in_stack_ffffffffffffffb0);
  pQVar8 = createHole((QPodArrayOps<QScriptItem> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
                      (qsizetype)in_RDX,CONCAT44(uVar10,uVar9));
  pQVar8->position = (int)uVar2;
  pQVar8->analysis = (QScriptAnalysis)(int)((ulong)uVar2 >> 0x20);
  pQVar8->num_glyphs = (short)uVar3;
  *(short *)&pQVar8->field_0xa = (short)((ulong)uVar3 >> 0x10);
  pQVar8->descent = (QFixed)(int)((ulong)uVar3 >> 0x20);
  pQVar8->ascent = (QFixed)(int)uVar4;
  pQVar8->leading = (QFixed)(int)((ulong)uVar4 >> 0x20);
  pQVar8->width = (QFixed)(int)uVar5;
  pQVar8->glyph_data_offset = (int)((ulong)uVar5 >> 0x20);
LAB_0083efb9:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }